

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

string * to_hex<unsigned_short>(string *__return_storage_ptr__,unsigned_short obj,size_t width)

{
  ostream *poVar1;
  stringstream ss;
  long local_190 [2];
  long lStack_180;
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  *(long *)((long)&lStack_180 + *(long *)(local_190[0] + -0x18)) = (long)(int)width;
  poVar1 = std::operator<<(local_190,0x30);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_hex(T obj, size_t width = sizeof(T) * 2)
{
    std::stringstream ss;
    ss << std::hex << std::setw(width) << std::setfill('0') << (size_t)obj;
    return ss.str();
}